

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdlcSimulationDataGenerator::TransmitBitSync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  bool bVar1;
  BitState bitState;
  size_type sVar2;
  byte *pbVar3;
  uint local_3c;
  BitState bit;
  U32 i;
  BitExtractor bit_extractor;
  U32 j;
  bool abortThisByte;
  U32 s;
  U32 index;
  BitState previousBit;
  U8 consecutiveOnes;
  bool abortFrame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  HdlcSimulationDataGenerator *this_local;
  
  CreateFlagBitSeq(this);
  bVar1 = ContainsElement(this,this->mFrameNumber);
  index._2_1_ = '\0';
  s = 0;
  j = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(stream);
    if (sVar2 <= j) {
      CreateFlagBitSeq(this);
      return;
    }
    if ((bVar1) && (this->mAbortByte == j)) break;
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](stream,(ulong)j)
    ;
    BitExtractor::BitExtractor((BitExtractor *)&bit,(ulong)*pbVar3,LsbFirst,8);
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      bitState = BitExtractor::GetNextBit();
      CreateSyncBit(this,bitState);
      if (bitState == BIT_HIGH) {
        if (s == 1) {
          index._2_1_ = index._2_1_ + '\x01';
        }
        else {
          index._2_1_ = '\0';
        }
      }
      else {
        index._2_1_ = '\0';
      }
      s = bitState;
      if (index._2_1_ == '\x04') {
        CreateSyncBit(this,BIT_LOW);
        index._2_1_ = '\0';
        s = 0;
      }
    }
    BitExtractor::~BitExtractor((BitExtractor *)&bit);
    j = j + 1;
  }
  for (_bit_extractor = 0; _bit_extractor < 7; _bit_extractor = _bit_extractor + 1) {
    CreateSyncBit(this,BIT_HIGH);
  }
  this->mAbortByte = this->mAbortByte + 1;
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitBitSync( const vector<U8>& stream )
{
    // Opening flag
    CreateFlagBitSeq();

    bool abortFrame = ContainsElement( mFrameNumber );

    U8 consecutiveOnes = 0;
    BitState previousBit = BIT_LOW;
    // For each byte of the stream
    U32 index = 0;
    for( U32 s = 0; s < stream.size(); ++s )
    {
        bool abortThisByte = ( mAbortByte == s );
        if( abortFrame && abortThisByte )
        {
            // Sync bit abort sequence = 7 or more consecutive 1
            for( U32 j = 0; j < 7; ++j )
            {
                CreateSyncBit( BIT_HIGH );
            }
            mAbortByte++;
            return;
        }

        // For each bit of the byte stream
        BitExtractor bit_extractor( stream[ s ], AnalyzerEnums::LsbFirst, 8 );
        for( U32 i = 0; i < 8; ++i )
        {
            BitState bit = bit_extractor.GetNextBit();
            CreateSyncBit( bit );

            if( bit == BIT_HIGH )
            {
                if( previousBit == BIT_HIGH )
                {
                    consecutiveOnes++;
                }
                else
                {
                    consecutiveOnes = 0;
                }
            }
            else // bit low
            {
                consecutiveOnes = 0;
            }

            if( consecutiveOnes == 4 ) // if five 1s in a row, then insert a 0 and continue
            {
                CreateSyncBit( BIT_LOW );
                consecutiveOnes = 0;
                previousBit = BIT_LOW;
            }
            else
            {
                previousBit = bit;
            }
            index++;
        }
    }

    // Closing flag
    CreateFlagBitSeq();
}